

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_0::BufferTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BufferTestInstance *this)

{
  VkDevice *ppVVar1;
  Handle<(vk::HandleType)8> HVar2;
  DeviceInterface *pDVar3;
  VkAllocationCallbacks *pVVar4;
  TestStatus *pTVar5;
  int iVar6;
  VkResult VVar7;
  InstanceInterface *pIVar8;
  VkPhysicalDevice pVVar9;
  VkDevice device;
  SparseContext *pSVar10;
  VkQueue pVVar11;
  undefined8 *puVar12;
  VkDevice vk;
  long *plVar13;
  ostream *poVar14;
  long lVar15;
  NotSupportedError *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  long *plVar17;
  char **value;
  uint uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [8];
  VkDevice pVVar21;
  VkDevice pVVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  VkMemoryAllocateInfo memAlloc;
  VkBuffer rawBuffer;
  deUint32 queueFamilyIndex;
  VkMemoryRequirements memReqs;
  VkBufferCreateInfo bufferParams;
  VkDeviceMemory rawMemory;
  VkSparseBufferMemoryBindInfo sparseBufferMemoryBindInfo;
  ostringstream errorMsg;
  VkPhysicalDeviceMemoryProperties memoryProperties;
  Move<vk::Handle<(vk::HandleType)8>_> local_848;
  undefined4 local_828;
  undefined1 local_818 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_808;
  string *local_7f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_7e8;
  BufferTestInstance *local_7e0;
  VkBuffer local_7d8;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_7d0;
  Handle<(vk::HandleType)8> local_7b0;
  long local_7a8;
  long local_7a0;
  long lStack_798;
  deUint32 local_78c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_788;
  undefined8 local_780;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_778;
  VkDeviceMemory local_768;
  Deleter<vk::Handle<(vk::HandleType)7>_> DStack_760;
  VkDevice local_748;
  VkDevice local_740;
  uint local_738;
  TestStatus *local_730;
  undefined1 local_728 [16];
  VkDevice local_718;
  VkDevice pVStack_710;
  undefined8 local_708;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **ppaStack_700;
  deUint32 *local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  Handle<(vk::HandleType)7> local_6c8 [2];
  long local_6b8 [2];
  long local_6a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6a0;
  undefined4 local_698;
  undefined1 *local_690;
  ulong local_688 [6];
  undefined1 local_658 [8];
  Deleter<vk::Handle<(vk::HandleType)8>_> aDStack_650 [4];
  ios_base local_5e8 [240];
  VkDevice local_4f8;
  VkPhysicalDeviceFeatures local_314;
  VkPhysicalDeviceMemoryProperties local_238;
  
  pIVar8 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVVar9 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceFeatures(&local_314,pIVar8,pVVar9);
  uVar18 = (this->m_testCase).flags;
  if (((uVar18 & 1) == 0) || (local_314.sparseBinding != 0)) {
    if (((uVar18 & 2) == 0) || (local_314.sparseResidencyBuffer != 0)) {
      if (((uVar18 & 4) == 0) || (local_314.sparseResidencyAliased != 0)) {
        local_688[0] = 1;
        local_688[1] = 0x49d;
        local_688[2] = 0x3e77;
        local_688[3] = 0x4000;
        local_688[4] = 0xffffffffffffffff;
        local_7f0 = (string *)&__return_storage_ptr__->m_description;
        local_7e8 = &(__return_storage_ptr__->m_description).field_2;
        lVar15 = 0;
        local_7e0 = this;
        local_730 = __return_storage_ptr__;
        do {
          pVVar21 = (VkDevice)local_688[lVar15];
          local_6a8 = lVar15;
          pVVar9 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
          pIVar8 = Context::getInstanceInterface((this->super_TestInstance).m_context);
          pSVar10 = (this->m_sparseContext).
                    super_UniqueBase<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext>_>
                    .m_data.ptr;
          if (pSVar10 == (SparseContext *)0x0) {
            device = Context::getDevice((this->super_TestInstance).m_context);
            pSVar10 = (this->m_sparseContext).
                      super_UniqueBase<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext>_>
                      .m_data.ptr;
            if (pSVar10 != (SparseContext *)0x0) goto LAB_0043514a;
            vk = (VkDevice)Context::getDeviceInterface((this->super_TestInstance).m_context);
            pSVar10 = (this->m_sparseContext).
                      super_UniqueBase<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext>_>
                      .m_data.ptr;
            if (pSVar10 != (SparseContext *)0x0) goto LAB_0043514e;
            local_78c = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
          }
          else {
            device = (pSVar10->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
LAB_0043514a:
            vk = (VkDevice)&pSVar10->m_deviceInterface;
LAB_0043514e:
            local_78c = pSVar10->m_queueFamilyIndex;
          }
          ::vk::getPhysicalDeviceMemoryProperties(&local_238,pIVar8,pVVar9);
          ::vk::getPhysicalDeviceProperties((VkPhysicalDeviceProperties *)local_658,pIVar8,pVVar9);
          DStack_7d0.m_device = (VkDevice)0x0;
          DStack_7d0.m_allocator = (VkAllocationCallbacks *)0x0;
          local_7d8.m_internal = 0;
          DStack_7d0.m_deviceIface = (DeviceInterface *)0x0;
          DStack_760.m_device = (VkDevice)0x0;
          DStack_760.m_allocator = (VkAllocationCallbacks *)0x0;
          local_768.m_internal = 0;
          DStack_760.m_deviceIface = (DeviceInterface *)0x0;
          uVar18 = (local_7e0->m_testCase).flags;
          pVVar22 = local_4f8;
          if (pVVar21 <= local_4f8) {
            pVVar22 = pVVar21;
          }
          if ((uVar18 & 1) == 0) {
            pVVar22 = pVVar21;
          }
          local_728._0_4_ = 0xc;
          local_728._8_8_ = (void *)0x0;
          local_718 = (VkDevice)CONCAT44(local_718._4_4_,uVar18);
          pVStack_710 = (VkDevice)&DAT_00000001;
          local_708._4_4_ = (local_7e0->m_testCase).sharingMode;
          local_708._0_4_ = (local_7e0->m_testCase).usage;
          ppaStack_700 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)CONCAT44(ppaStack_700._4_4_,1);
          local_6f8 = &local_78c;
          ::vk::createBuffer(&local_848,(DeviceInterface *)vk,device,(VkBufferCreateInfo *)local_728
                             ,(VkAllocationCallbacks *)0x0);
          pVVar4 = local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                   m_allocator;
          pVVar21 = local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
          pDVar3 = local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                   m_deviceIface;
          HVar2.m_internal =
               local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
          aDStack_650[0].m_device =
               local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
          aDStack_650[0].m_allocator =
               local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
          local_658 = (undefined1  [8])
                      local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                      m_internal;
          aDStack_650[0].m_deviceIface =
               local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
          local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
          local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
               (DeviceInterface *)0x0;
          local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
               (VkDevice)0x0;
          local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
               (VkAllocationCallbacks *)0x0;
          if (local_7d8.m_internal == 0) {
            DStack_7d0.m_device = pVVar21;
            DStack_7d0.m_allocator = pVVar4;
            local_7d8.m_internal = HVar2.m_internal;
            DStack_7d0.m_deviceIface = pDVar3;
          }
          else {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                      (&DStack_7d0,local_7d8);
            local_7d8.m_internal = (deUint64)local_658;
            DStack_7d0.m_deviceIface = aDStack_650[0].m_deviceIface;
            DStack_7d0.m_device = aDStack_650[0].m_device;
            DStack_7d0.m_allocator = aDStack_650[0].m_allocator;
            if (local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal !=
                0) {
              ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                        (&local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
                         (VkBuffer)
                         local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                         m_internal);
            }
          }
          (**(code **)(*(long *)vk + 0x70))(vk,device,local_7d8.m_internal,&local_748);
          pTVar5 = local_730;
          if (local_738 == 0) {
            uVar18 = 0x20;
          }
          else {
            uVar18 = 0;
            if (local_738 != 0) {
              for (; (local_738 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
          }
          pVVar21 = (VkDevice)
                    (-(long)local_740 &
                    (ulong)(local_740 +
                           ((local_238.memoryHeaps[local_238.memoryTypes[uVar18].heapIndex].size >>
                            1) - 1)));
          if (pVVar22 <=
              (VkDevice)
              (-(long)local_740 &
              (ulong)(local_740 +
                     ((local_238.memoryHeaps[local_238.memoryTypes[uVar18].heapIndex].size >> 1) - 1
                     )))) {
            pVVar21 = pVVar22;
          }
          do {
            while( true ) {
              if ((VkDevice)local_768.m_internal != (VkDevice)0x0) {
                if (((local_7e0->m_testCase).flags & 7) == 0) {
                  iVar6 = (**(code **)(*(long *)vk + 0x60))(vk,device,local_7d8.m_internal);
                  this = local_7e0;
                  paVar23 = local_7e8;
                  if (iVar6 != 0) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_658);
                    std::ostream::_M_insert<unsigned_long>((ulong)local_658);
                    std::__cxx11::stringbuf::str();
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_658);
                    std::ios_base::~ios_base(local_5e8);
                    puVar12 = (undefined8 *)
                              std::__cxx11::string::replace((ulong)local_818,0,(char *)0x0,0xad0cd3)
                    ;
                    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(puVar12 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar12 == paVar16) {
                      local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                      m_device = (VkDevice)paVar16->_M_allocated_capacity;
                      local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                      m_allocator = (VkAllocationCallbacks *)puVar12[3];
                      local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                      m_internal = (deUint64)
                                   &local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                                    deleter.m_device;
                    }
                    else {
                      local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                      m_device = (VkDevice)paVar16->_M_allocated_capacity;
                      local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                      m_internal = (deUint64)*puVar12;
                    }
                    local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                    m_deviceIface = (DeviceInterface *)puVar12[1];
                    *puVar12 = paVar16;
                    puVar12[1] = 0;
                    *(undefined1 *)(puVar12 + 2) = 0;
                    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_848);
                    local_728._0_8_ = local_728 + 0x10;
                    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(puVar12 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar12 == paVar16) {
                      local_718 = (VkDevice)paVar16->_M_allocated_capacity;
                      pVStack_710 = (VkDevice)puVar12[3];
                    }
                    else {
                      local_718 = (VkDevice)paVar16->_M_allocated_capacity;
                      local_728._0_8_ =
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)*puVar12;
                    }
                    local_728._8_8_ = puVar12[1];
                    *puVar12 = paVar16;
                    puVar12[1] = 0;
                    *(undefined1 *)(puVar12 + 2) = 0;
                    pTVar5->m_code = QP_TEST_RESULT_FAIL;
                    (pTVar5->m_description)._M_dataplus._M_p = (pointer)paVar23;
                    std::__cxx11::string::_M_construct<char*>
                              (local_7f0,local_728._0_8_,(char *)(local_728._8_8_ + local_728._0_8_)
                              );
                    pVVar21 = local_718;
                    auVar20 = (undefined1  [8])local_728._0_8_;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_728._0_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_728 + 0x10)) goto LAB_00435e2c;
                    goto LAB_00435e34;
                  }
                }
                else {
                  pVVar11 = ::vk::getDeviceQueue((DeviceInterface *)vk,device,local_78c,0);
                  local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
                       0;
                  local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                  m_deviceIface = (DeviceInterface *)local_748;
                  local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
                       (VkDevice)local_768.m_internal;
                  local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator
                       = (VkAllocationCallbacks *)0x0;
                  local_828 = 0;
                  local_6a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_7d8.m_internal;
                  local_698 = 1;
                  local_728._8_8_ = (void *)0x0;
                  local_6d8 = 0;
                  uStack_6d0 = 0;
                  local_6e8 = 0;
                  uStack_6e0 = 0;
                  local_6f8 = (deUint32 *)0x0;
                  uStack_6f0 = 0;
                  local_718 = (VkDevice)0x0;
                  pVStack_710 = (VkDevice)0x0;
                  local_728._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x7;
                  local_708._0_4_ = 1;
                  local_708._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
                  ppaStack_700 = &local_6a0;
                  local_690 = (undefined1 *)&local_848;
                  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)local_658,
                                    (DeviceInterface *)vk,device,0,(VkAllocationCallbacks *)0x0);
                  local_808._M_allocated_capacity = (size_type)aDStack_650[0].m_device;
                  local_808._8_8_ = aDStack_650[0].m_allocator;
                  local_818._0_8_ = local_658;
                  local_818._8_8_ = aDStack_650[0].m_deviceIface;
                  iVar6 = (**(code **)(*(long *)vk + 0x88))(vk,pVVar11,1,local_728,local_658);
                  if (iVar6 == 0) {
                    VVar7 = (**(code **)(*(long *)vk + 0xb0))
                                      (vk,device,1,local_818,1,0xffffffffffffffff);
                    ::vk::checkResult(VVar7,
                                      "vk.waitForFences(vkDevice, 1, &fence.get(), VK_TRUE, ~(0ull) )"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiBufferTests.cpp"
                                      ,0x15d);
                  }
                  else {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_658);
                    std::ostream::_M_insert<unsigned_long>((ulong)local_658);
                    std::__cxx11::stringbuf::str();
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_658);
                    std::ios_base::~ios_base(local_5e8);
                    puVar12 = (undefined8 *)
                              std::__cxx11::string::replace((ulong)local_6c8,0,(char *)0x0,0xad0c59)
                    ;
                    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(puVar12 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar12 == paVar23) {
                      local_778._M_allocated_capacity = paVar23->_M_allocated_capacity;
                      local_778._8_8_ = puVar12[3];
                      local_788 = &local_778;
                    }
                    else {
                      local_778._M_allocated_capacity = paVar23->_M_allocated_capacity;
                      local_788 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)*puVar12;
                    }
                    local_780 = puVar12[1];
                    *puVar12 = paVar23;
                    puVar12[1] = 0;
                    *(undefined1 *)(puVar12 + 2) = 0;
                    plVar13 = (long *)std::__cxx11::string::append((char *)&local_788);
                    plVar17 = plVar13 + 2;
                    if ((long *)*plVar13 == plVar17) {
                      local_7a0 = *plVar17;
                      lStack_798 = plVar13[3];
                      local_7b0.m_internal = (deUint64)&local_7a0;
                    }
                    else {
                      local_7a0 = *plVar17;
                      local_7b0.m_internal = (deUint64)*plVar13;
                    }
                    local_7a8 = plVar13[1];
                    *plVar13 = (long)plVar17;
                    plVar13[1] = 0;
                    *(undefined1 *)(plVar13 + 2) = 0;
                    pTVar5->m_code = QP_TEST_RESULT_FAIL;
                    (pTVar5->m_description)._M_dataplus._M_p = (pointer)local_7e8;
                    std::__cxx11::string::_M_construct<char*>
                              (local_7f0,local_7b0.m_internal,local_7a8 + local_7b0.m_internal);
                    if ((long *)local_7b0.m_internal != &local_7a0) {
                      operator_delete((void *)local_7b0.m_internal,local_7a0 + 1);
                    }
                    if (local_788 != &local_778) {
                      operator_delete(local_788,(ulong)(local_778._M_allocated_capacity + 1));
                    }
                    if ((long *)local_6c8[0].m_internal != local_6b8) {
                      operator_delete((void *)local_6c8[0].m_internal,local_6b8[0] + 1);
                    }
                  }
                  if ((pointer)local_818._0_8_ != (pointer)0x0) {
                    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                              ((Deleter<vk::Handle<(vk::HandleType)6>_> *)(local_818 + 8),
                               (VkFence)local_818._0_8_);
                  }
                  this = local_7e0;
                  paVar23 = local_7e8;
                  if (iVar6 != 0) goto LAB_00435e66;
                }
                this = local_7e0;
                paVar23 = local_7e8;
                ppVVar1 = &aDStack_650[0].m_device;
                aDStack_650[0].m_deviceIface = (DeviceInterface *)0x4;
                aDStack_650[0].m_device =
                     (VkDevice)CONCAT35(aDStack_650[0].m_device._5_3_,0x73736150);
                pTVar5->m_code = QP_TEST_RESULT_PASS;
                (pTVar5->m_description)._M_dataplus._M_p = (pointer)local_7e8;
                local_658 = (undefined1  [8])ppVVar1;
                std::__cxx11::string::_M_construct<char*>
                          (local_7f0,ppVVar1,(undefined1 *)((long)&aDStack_650[0].m_device + 4));
                uVar19 = aDStack_650[0].m_device;
                auVar20 = local_658;
                if (local_658 != (undefined1  [8])ppVVar1) goto LAB_00435e5e;
                goto LAB_00435e66;
              }
              local_7b0.m_internal = 0;
              aDStack_650[0].m_device = (VkDevice)0x0;
              aDStack_650[0].m_allocator = (VkAllocationCallbacks *)0x0;
              local_658 = (undefined1  [8])0x0;
              aDStack_650[0].m_deviceIface = (DeviceInterface *)0x0;
              pVStack_710 = pVVar21;
              if (local_7d8.m_internal == 0) {
                DStack_7d0.m_device = (VkDevice)0x0;
                DStack_7d0.m_allocator = (VkAllocationCallbacks *)0x0;
                local_7d8.m_internal = 0;
                DStack_7d0.m_deviceIface = (DeviceInterface *)0x0;
              }
              else {
                ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                          (&DStack_7d0,local_7d8);
                local_7d8.m_internal = 0;
                DStack_7d0.m_deviceIface = (DeviceInterface *)0x0;
                DStack_7d0.m_device = (VkDevice)0x0;
                DStack_7d0.m_allocator = (VkAllocationCallbacks *)0x0;
                if (local_658 != (undefined1  [8])0x0) {
                  ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                            (aDStack_650,(VkBuffer)local_658);
                }
              }
              VVar7 = (**(code **)(*(long *)vk + 0x108))(vk,device,local_728,0);
              if (VVar7 != VK_SUCCESS) break;
              local_658 = (undefined1  [8])
                          ::vk::refdetails::check<vk::Handle<(vk::HandleType)8>>(local_7b0);
              aDStack_650[0].m_allocator = (VkAllocationCallbacks *)0x0;
              local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
                   (VkDevice)0x0;
              local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
                   (VkAllocationCallbacks *)0x0;
              local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
              local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
                   (DeviceInterface *)0x0;
              aDStack_650[0].m_deviceIface = (DeviceInterface *)vk;
              aDStack_650[0].m_device = device;
              if (local_7d8.m_internal == 0) {
                DStack_7d0.m_allocator = (VkAllocationCallbacks *)0x0;
                local_7d8.m_internal = (deUint64)local_658;
                DStack_7d0.m_deviceIface = (DeviceInterface *)vk;
                DStack_7d0.m_device = device;
              }
              else {
                ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                          (&DStack_7d0,local_7d8);
                local_7d8.m_internal = (deUint64)local_658;
                DStack_7d0.m_deviceIface = aDStack_650[0].m_deviceIface;
                DStack_7d0.m_device = aDStack_650[0].m_device;
                DStack_7d0.m_allocator = aDStack_650[0].m_allocator;
                if (local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
                    != 0) {
                  ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                            (&local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter
                             ,(VkBuffer)
                              local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                              m_internal);
                }
              }
              (**(code **)(*(long *)vk + 0x70))(vk,device,local_7d8.m_internal);
              if (local_748 < pVVar21) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_658);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_658,"Requied memory size (",0x15);
                this = local_7e0;
                poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)local_658);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14," bytes) smaller than the buffer\'s size (",0x28);
                poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14," bytes)!",8);
                std::__cxx11::stringbuf::str();
                pTVar5->m_code = QP_TEST_RESULT_FAIL;
                (pTVar5->m_description)._M_dataplus._M_p = (pointer)local_7e8;
                std::__cxx11::string::_M_construct<char*>
                          (local_7f0,
                           local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                           m_internal,
                           (VkDevice)
                           ((long)local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                                  deleter.m_deviceIface +
                           local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                           m_internal));
                if ((VkDevice *)
                    local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
                    != &local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                        m_device) {
                  operator_delete((void *)local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                                          m_data.object.m_internal,
                                  (ulong)(local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                                          m_data.deleter.m_device + 1));
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_658);
                std::ios_base::~ios_base(local_5e8);
                paVar23 = local_7e8;
                goto LAB_00435e66;
              }
              local_6c8[0].m_internal = 0;
              local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._0_4_
                   = 5;
              local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
                   (DeviceInterface *)0x0;
              local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
                   local_748;
              local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
                   (VkAllocationCallbacks *)
                   CONCAT44(local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                            m_allocator._4_4_,uVar18);
              iVar6 = (**(code **)(*(long *)vk + 0x28))(vk,device,&local_848,0);
              if (iVar6 == 0) {
                local_658 = (undefined1  [8])
                            ::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>(local_6c8[0]);
                aDStack_650[0].m_allocator = (VkAllocationCallbacks *)0x0;
                local_808._M_allocated_capacity = 0;
                local_808._8_8_ = (VkAllocationCallbacks *)0x0;
                local_818._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_818._8_8_ = (VkDevice)0x0;
                if (local_768.m_internal == 0) {
                  DStack_760.m_allocator = (VkAllocationCallbacks *)0x0;
                  local_768.m_internal = (deUint64)local_658;
                  DStack_760.m_deviceIface = (DeviceInterface *)vk;
                  DStack_760.m_device = device;
                  aDStack_650[0].m_deviceIface = (DeviceInterface *)vk;
                  aDStack_650[0].m_device = device;
                  aDStack_650[0].m_allocator = (VkAllocationCallbacks *)0x0;
                }
                else {
                  aDStack_650[0].m_deviceIface = (DeviceInterface *)vk;
                  aDStack_650[0].m_device = device;
                  ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                            (&DStack_760,local_768);
                  local_768.m_internal = (deUint64)local_658;
                  DStack_760.m_deviceIface = aDStack_650[0].m_deviceIface;
                  DStack_760.m_device = aDStack_650[0].m_device;
                  DStack_760.m_allocator = aDStack_650[0].m_allocator;
                  if ((pointer)local_818._0_8_ != (pointer)0x0) {
                    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                              ((Deleter<vk::Handle<(vk::HandleType)7>_> *)(local_818 + 8),
                               (VkDeviceMemory)local_818._0_8_);
                  }
                }
              }
              else {
                pVVar21 = (VkDevice)
                          (-(long)local_740 & (ulong)(local_740 + (((ulong)pVVar21 >> 4) - 1)));
                if ((pVVar21 == (VkDevice)0x0) || (local_748 == local_740)) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_658);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_658);
                  this = local_7e0;
                  paVar23 = local_7e8;
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_658);
                  std::ios_base::~ios_base(local_5e8);
                  plVar13 = (long *)std::__cxx11::string::replace
                                              ((ulong)&local_788,0,(char *)0x0,0xad0c34);
                  local_7b0.m_internal = (deUint64)&local_7a0;
                  plVar17 = plVar13 + 2;
                  if ((long *)*plVar13 == plVar17) {
                    local_7a0 = *plVar17;
                    lStack_798 = plVar13[3];
                  }
                  else {
                    local_7a0 = *plVar17;
                    local_7b0.m_internal = (deUint64)*plVar13;
                  }
                  local_7a8 = plVar13[1];
                  *plVar13 = (long)plVar17;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_7b0);
                  local_818._0_8_ = &local_808;
                  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(puVar12 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar12 == paVar16) {
                    local_808._M_allocated_capacity = paVar16->_M_allocated_capacity;
                    local_808._8_8_ = puVar12[3];
                  }
                  else {
                    local_808._M_allocated_capacity = paVar16->_M_allocated_capacity;
                    local_818._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)*puVar12;
                  }
                  local_818._8_8_ = puVar12[1];
                  *puVar12 = paVar16;
                  puVar12[1] = 0;
                  *(undefined1 *)(puVar12 + 2) = 0;
                  pTVar5->m_code = QP_TEST_RESULT_FAIL;
                  (pTVar5->m_description)._M_dataplus._M_p = (pointer)paVar23;
                  std::__cxx11::string::_M_construct<char*>
                            (local_7f0,local_818._0_8_,(VkDevice)(local_818._8_8_ + local_818._0_8_)
                            );
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_818._0_8_ != &local_808) {
                    operator_delete((void *)local_818._0_8_,
                                    (ulong)(local_808._M_allocated_capacity + 1));
                  }
                  if ((long *)local_7b0.m_internal != &local_7a0) {
                    operator_delete((void *)local_7b0.m_internal,local_7a0 + 1);
                  }
                  uVar19 = local_778._M_allocated_capacity;
                  auVar20 = (undefined1  [8])local_788;
                  if (local_788 == &local_778) goto LAB_00435e66;
                  goto LAB_00435e5e;
                }
              }
            }
            pVVar21 = (VkDevice)
                      (-(long)local_740 & (ulong)(local_740 + (((ulong)pVVar21 >> 4) - 1)));
          } while ((pVVar21 != (VkDevice)0x0) && (pVStack_710 != local_740));
          local_788 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)::vk::getResultName(VVar7);
          de::toString<char_const*>((string *)local_818,(de *)&local_788,value);
          puVar12 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_818,0,(char *)0x0,0xad0bd2);
          this = local_7e0;
          paVar23 = local_7e8;
          local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
               (deUint64)
               &local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 == paVar16) {
            local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
                 (VkDevice)paVar16->_M_allocated_capacity;
            local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
                 (VkAllocationCallbacks *)puVar12[3];
          }
          else {
            local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
                 (VkDevice)paVar16->_M_allocated_capacity;
            local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
                 (deUint64)*puVar12;
          }
          local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
               (DeviceInterface *)puVar12[1];
          *puVar12 = paVar16;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_848);
          local_658 = (undefined1  [8])&aDStack_650[0].m_device;
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 == paVar16) {
            aDStack_650[0].m_device = (VkDevice)paVar16->_M_allocated_capacity;
            aDStack_650[0].m_allocator = (VkAllocationCallbacks *)puVar12[3];
          }
          else {
            aDStack_650[0].m_device = (VkDevice)paVar16->_M_allocated_capacity;
            local_658 = (undefined1  [8])*puVar12;
          }
          aDStack_650[0].m_deviceIface = (DeviceInterface *)puVar12[1];
          *puVar12 = paVar16;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          pTVar5->m_code = QP_TEST_RESULT_FAIL;
          (pTVar5->m_description)._M_dataplus._M_p = (pointer)paVar23;
          std::__cxx11::string::_M_construct<char*>
                    (local_7f0,local_658,
                     (VkDevice)((long)aDStack_650[0].m_deviceIface + (long)local_658));
          pVVar21 = aDStack_650[0].m_device;
          auVar20 = local_658;
          if (local_658 != (undefined1  [8])&aDStack_650[0].m_device) {
LAB_00435e2c:
            operator_delete((void *)auVar20,(ulong)(pVVar21 + 1));
          }
LAB_00435e34:
          if ((VkDevice *)
              local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal !=
              &local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device) {
            operator_delete((void *)local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                                    object.m_internal,
                            (ulong)(local_848.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                                    deleter.m_device + 1));
          }
          uVar19 = local_808._M_allocated_capacity;
          auVar20 = (undefined1  [8])local_818._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_818._0_8_ != &local_808) {
LAB_00435e5e:
            operator_delete((void *)auVar20,(ulong)(uVar19 + 1));
          }
LAB_00435e66:
          if (local_768.m_internal != 0) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                      (&DStack_760,local_768);
          }
          if (local_7d8.m_internal != 0) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                      (&DStack_7d0,local_7d8);
          }
          if (pTVar5->m_code != QP_TEST_RESULT_PASS) {
            return pTVar5;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(long **)local_7f0 != paVar23) {
            operator_delete(*(long **)local_7f0,paVar23->_M_allocated_capacity + 1);
          }
          lVar15 = local_6a8 + 1;
          if (lVar15 == 5) {
            local_658 = (undefined1  [8])&aDStack_650[0].m_device;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"Pass","");
            pTVar5->m_code = QP_TEST_RESULT_PASS;
            (pTVar5->m_description)._M_dataplus._M_p = (pointer)paVar23;
            std::__cxx11::string::_M_construct<char*>
                      (local_7f0,local_658,
                       (VkDevice)((long)aDStack_650[0].m_deviceIface + (long)local_658));
            if (local_658 != (undefined1  [8])&aDStack_650[0].m_device) {
              operator_delete((void *)local_658,(ulong)(aDStack_650[0].m_device + 1));
            }
            return pTVar5;
          }
        } while( true );
      }
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Sparse aliased residency feature is not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiBufferTests.cpp"
                 ,0x173);
    }
    else {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Sparse buffer residency feature is not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiBufferTests.cpp"
                 ,0x170);
    }
  }
  else {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Sparse bindings feature is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiBufferTests.cpp"
               ,0x16d);
  }
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus BufferTestInstance::iterate (void)
{
	const VkPhysicalDeviceFeatures&	physicalDeviceFeatures	= getPhysicalDeviceFeatures(getInstanceInterface(), getPhysicalDevice());

	if ((m_testCase.flags & VK_BUFFER_CREATE_SPARSE_BINDING_BIT ) && !physicalDeviceFeatures.sparseBinding)
		TCU_THROW(NotSupportedError, "Sparse bindings feature is not supported");

	if ((m_testCase.flags & VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT ) && !physicalDeviceFeatures.sparseResidencyBuffer)
		TCU_THROW(NotSupportedError, "Sparse buffer residency feature is not supported");

	if ((m_testCase.flags & VK_BUFFER_CREATE_SPARSE_ALIASED_BIT ) && !physicalDeviceFeatures.sparseResidencyAliased)
		TCU_THROW(NotSupportedError, "Sparse aliased residency feature is not supported");

	const VkDeviceSize testSizes[] =
	{
		1,
		1181,
		15991,
		16384,
		~0ull,		// try to exercise a very large buffer too (will be clamped to a sensible size later)
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(testSizes); ++i)
	{
		const tcu::TestStatus testStatus = bufferCreateAndAllocTest(testSizes[i]);

		if (testStatus.getCode() != QP_TEST_RESULT_PASS)
			return testStatus;
	}

	return tcu::TestStatus::pass("Pass");
}